

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapOrSetDataList.h
# Opt level: O1

bool __thiscall Js::MapOrSetDataList<void_*>::Iterator::Next(Iterator *this)

{
  Type *addr;
  MapOrSetDataList<void_*> *pMVar1;
  MapOrSetDataNode<void_*> *pMVar2;
  MapOrSetDataNode<void_*> *pMVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  
  pMVar1 = (this->list).ptr;
  if ((pMVar1 != (MapOrSetDataList<void_*> *)0x0) &&
     ((pMVar1->first).ptr != (MapOrSetDataNode<void_*> *)0x0)) {
    addr = &this->current;
    if ((this->current).ptr != (MapOrSetDataNode<void_*> *)0x0) {
      while( true ) {
        pMVar2 = addr->ptr;
        pMVar3 = (pMVar2->prev).ptr;
        if (pMVar3 == (MapOrSetDataNode<void_*> *)0x0) break;
        if ((pMVar3->next).ptr == pMVar2) {
          if (pMVar3 != (MapOrSetDataNode<void_*> *)0x0) goto LAB_008cb304;
          break;
        }
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = pMVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      }
      pMVar3 = (((this->list).ptr)->first).ptr;
      if (pMVar2 != pMVar3) {
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = pMVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        if (addr->ptr != (MapOrSetDataNode<void_*> *)0x0) {
          return true;
        }
        goto LAB_008cb399;
      }
LAB_008cb304:
      if (((pMVar2->next).ptr == (MapOrSetDataNode<void_*> *)0x0) &&
         (pMVar3 = (((this->list).ptr)->last).ptr, pMVar2 != pMVar3)) {
        if (pMVar3 != (MapOrSetDataNode<void_*> *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                      ,100,"(list->last == nullptr)","list->last == nullptr");
          if (!bVar5) goto LAB_008cb421;
          *puVar6 = 0;
        }
        addr->ptr = (MapOrSetDataNode<void_*> *)0x0;
      }
    }
    pMVar1 = (this->list).ptr;
    pMVar2 = (this->current).ptr;
    if (pMVar2 != (pMVar1->last).ptr) {
      if (pMVar2 == (MapOrSetDataNode<void_*> *)0x0) {
        if ((pMVar1->first).ptr == (MapOrSetDataNode<void_*> *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                      ,0x6d,"(list->first != nullptr)","list->first != nullptr");
          if (!bVar5) {
LAB_008cb421:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar6 = 0;
        }
        pMVar2 = (((this->list).ptr)->first).ptr;
        Memory::Recycler::WBSetBit((char *)addr);
        (this->current).ptr = pMVar2;
      }
      else {
        pMVar2 = (pMVar2->next).ptr;
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = pMVar2;
      }
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      return true;
    }
  }
LAB_008cb399:
  (this->list).ptr = (MapOrSetDataList<void_*> *)0x0;
  (this->current).ptr = (MapOrSetDataNode<void_*> *)0x0;
  return false;
}

Assistant:

bool Next()
            {
                // Nodes can be deleted while iterating so validate current
                // and if it is not valid find last valid node by following
                // previous toward first.
                // Note: clear will simply null out first and last, but
                // not invalidated nodes, so we must also check to see that
                // first is not null

                if (list == nullptr || list->first == nullptr)
                {
                    // list is empty or was cleared during enumeration
                    list = nullptr;
                    current = nullptr;
                    return false;
                }

                if (current)
                {
                    while (current->prev && current->prev->next != current)
                    {
                        current = current->prev;
                    }

                    if (current->prev == nullptr && current != list->first)
                    {
                        current = list->first;

                        if (current != nullptr)
                        {
                            return true;
                        }

                        list = nullptr;
                        current = nullptr;
                        return false;
                    }

                    if (current->next == nullptr && current != list->last)
                    {
                        Assert(list->last == nullptr);
                        current = nullptr;
                    }
                }

                if (current != list->last)
                {
                    if (current == nullptr)
                    {
                        Assert(list->first != nullptr);
                        current = list->first;
                    }
                    else
                    {
                        current = current->next;
                    }
                    return true;
                }

                list = nullptr;
                current = nullptr;
                return false;
            }